

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O3

bool __thiscall QTextUndoCommand::tryMerge(QTextUndoCommand *this,QTextUndoCommand *other)

{
  quint16 qVar1;
  anon_union_8_4_8516307b_for_QTextUndoCommand_8 aVar2;
  undefined1 uVar3;
  quint8 qVar4;
  int iVar5;
  quint32 qVar6;
  quint32 qVar7;
  quint32 qVar8;
  undefined4 uVar9;
  int iVar10;
  anon_union_8_4_8516307b_for_QTextUndoCommand_8 *paVar11;
  
  qVar1 = this->command;
  if (qVar1 != other->command) {
    return false;
  }
  if (qVar1 == 1) {
    if (((this->pos != other->pos) ||
        (iVar10 = (this->field_8).blockFormat, this->strPos + iVar10 != other->strPos)) ||
       (this->format != other->format)) {
      if (other->pos + (other->field_8).blockFormat != this->pos) {
        return false;
      }
      if ((other->field_8).blockFormat + other->strPos != this->strPos) {
        return false;
      }
      if (this->format != other->format) {
        return false;
      }
      uVar3 = other->field_0x2;
      qVar4 = other->operation;
      iVar5 = other->format;
      qVar6 = other->strPos;
      qVar7 = other->pos;
      aVar2 = other->field_8;
      qVar8 = other->revision;
      uVar9 = *(undefined4 *)&other->field_0x1c;
      paVar11 = &this->field_8;
      iVar10 = (this->field_8).blockFormat;
      this->command = other->command;
      this->field_0x2 = uVar3;
      this->operation = qVar4;
      this->format = iVar5;
      this->strPos = qVar6;
      this->pos = qVar7;
      this->field_8 = aVar2;
      this->revision = qVar8;
      *(undefined4 *)&this->field_0x1c = uVar9;
      goto LAB_004cfe2f;
    }
  }
  else {
    if (qVar1 != 0) {
      return false;
    }
    iVar10 = (this->field_8).blockFormat;
    if (this->pos + iVar10 != other->pos) {
      return false;
    }
    if (this->strPos + iVar10 != other->strPos) {
      return false;
    }
    if (this->format != other->format) {
      return false;
    }
  }
  paVar11 = &other->field_8;
LAB_004cfe2f:
  (this->field_8).blockFormat = iVar10 + paVar11->blockFormat;
  return true;
}

Assistant:

bool QTextUndoCommand::tryMerge(const QTextUndoCommand &other)
{
    if (command != other.command)
        return false;

    if (command == Inserted
        && (pos + length == other.pos)
        && (strPos + length == other.strPos)
        && format == other.format) {

        length += other.length;
        return true;
    }

    // removal to the 'right' using 'Delete' key
    if (command == Removed
        && pos == other.pos
        && (strPos + length == other.strPos)
        && format == other.format) {

        length += other.length;
        return true;
    }

    // removal to the 'left' using 'Backspace'
    if (command == Removed
        && (other.pos + other.length == pos)
        && (other.strPos + other.length == strPos)
        && (format == other.format)) {

        int l = length;
        (*this) = other;

        length += l;
        return true;
    }

    return false;
}